

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_destroy_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long in_RDX;
  value in_stack_00000050;
  uint local_4;
  
  if (in_RDX != 0) {
    value_type_destroy(in_stack_00000050);
  }
  local_4 = (uint)(in_RDX == 0);
  return local_4;
}

Assistant:

int scope_destroy_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;
	(void)key;
	(void)args;

	if (val != NULL)
	{
		value_type_destroy(val);

		return 0;
	}

	return 1;
}